

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void array_bitset_container_lazy_xor
               (array_container_t *src_1,bitset_container_t *src_2,bitset_container_t *dst)

{
  bitset_container_t *dst_local;
  bitset_container_t *src_2_local;
  array_container_t *src_1_local;
  
  if (src_2 != dst) {
    bitset_container_copy(src_2,dst);
  }
  bitset_flip_list(dst->words,src_1->array,(long)src_1->cardinality);
  dst->cardinality = -1;
  return;
}

Assistant:

void array_bitset_container_lazy_xor(const array_container_t *src_1,
                                     const bitset_container_t *src_2,
                                     bitset_container_t *dst) {
    if (src_2 != dst) bitset_container_copy(src_2, dst);
    bitset_flip_list(dst->words, src_1->array, src_1->cardinality);
    dst->cardinality = BITSET_UNKNOWN_CARDINALITY;
}